

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

int __thiscall helics::CommonCore::getErrorCode(CommonCore *this)

{
  long in_RDI;
  memory_order __b;
  
  CLI::std::operator&(seq_cst,__memory_order_mask);
  return *(int *)(in_RDI + 0x230);
}

Assistant:

int CommonCore::getErrorCode() const
{
    return lastErrorCode.load();
}